

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::DecimalQuantity::shiftRight(DecimalQuantity *this,int32_t numDigits)

{
  int8_t *piVar1;
  int iVar2;
  ulong uVar3;
  
  if (this->usingBytes == true) {
    iVar2 = this->precision;
    uVar3 = 0;
    if (numDigits < iVar2) {
      uVar3 = 0;
      do {
        piVar1 = (this->fBCD).bcdBytes.ptr;
        piVar1[uVar3] = piVar1[(long)numDigits + uVar3];
        uVar3 = uVar3 + 1;
        iVar2 = this->precision;
      } while ((long)uVar3 < (long)(iVar2 - numDigits));
    }
    if ((int)uVar3 < iVar2) {
      uVar3 = uVar3 & 0xffffffff;
      do {
        (this->fBCD).bcdBytes.ptr[uVar3] = '\0';
        uVar3 = uVar3 + 1;
        iVar2 = this->precision;
      } while ((int)uVar3 < iVar2);
    }
  }
  else {
    (this->fBCD).bcdLong = (this->fBCD).bcdLong >> ((char)numDigits * '\x04' & 0x3fU);
    iVar2 = this->precision;
  }
  this->scale = this->scale + numDigits;
  this->precision = iVar2 - numDigits;
  return;
}

Assistant:

void DecimalQuantity::shiftRight(int32_t numDigits) {
    if (usingBytes) {
        int i = 0;
        for (; i < precision - numDigits; i++) {
            fBCD.bcdBytes.ptr[i] = fBCD.bcdBytes.ptr[i + numDigits];
        }
        for (; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = 0;
        }
    } else {
        fBCD.bcdLong >>= (numDigits * 4);
    }
    scale += numDigits;
    precision -= numDigits;
}